

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_fe241b::AverageTest8bpp_DISABLED_Speed_Test::TestBody
          (AverageTest8bpp_DISABLED_Speed_Test *this)

{
  AverageTest<unsigned_char> *in_RDI;
  int in_stack_ffffffffffffffec;
  
  AverageTest<unsigned_char>::TestRandom(in_RDI,in_stack_ffffffffffffffec);
  AverageTest<unsigned_char>::PrintTimingStats(in_RDI);
  return;
}

Assistant:

TEST_P(AverageTest8bpp, DISABLED_Speed) {
  TestRandom(1000000);
  PrintTimingStats();
}